

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPRThreaTest.cpp
# Opt level: O2

void printInt(int num)

{
  ostream *poVar1;
  int iVar2;
  bool bVar3;
  
  iVar2 = 2;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    poVar1 = std::operator<<((ostream *)&std::cout,"num: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,num);
    std::endl<char,std::char_traits<char>>(poVar1);
    sleep(1);
  }
  return;
}

Assistant:

void printInt(int num)
{
    for(int i=0;i<2;++i)
    {
        std::cout << "num: " << num << std::endl;
        ::sleep(1);
    }
}